

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

int __thiscall
Centaurus::NFA<char>::select
          (NFA<char> *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  pointer pNVar1;
  int extraout_EAX;
  int iVar2;
  undefined4 in_register_00000034;
  long lVar3;
  NFABaseState<char,_int> *src;
  NFABaseState<char,_int> *pNVar4;
  NFABaseState<char,_int> local_60;
  NFA<char> *local_38;
  
  lVar3 = CONCAT44(in_register_00000034,__nfds);
  pNVar4 = (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_60._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019bf68;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                              super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar4) >> 3) *
          -0x33333333;
  NFABaseState<char,_int>::add_transition(pNVar4,(CharClass<char> *)&local_60,iVar2,false);
  local_60._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019bf68;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
            ((vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *)
             &local_60.m_transitions);
  src = *(NFABaseState<char,_int> **)(lVar3 + 8);
  iVar2 = iVar2 + -1;
  pNVar4 = src + 1;
  if (pNVar4 != *(NFABaseState<char,_int> **)(lVar3 + 0x10)) {
    local_38 = this;
    do {
      NFABaseState<char,_int>::offset(&local_60,pNVar4,iVar2);
      std::
      vector<Centaurus::NFABaseState<char,int>,std::allocator<Centaurus::NFABaseState<char,int>>>::
      emplace_back<Centaurus::NFABaseState<char,int>>
                ((vector<Centaurus::NFABaseState<char,int>,std::allocator<Centaurus::NFABaseState<char,int>>>
                  *)&(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states,&local_60);
      local_60._vptr_NFABaseState = (_func_int **)&PTR__NFABaseState_0019bf00;
      std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
      ::~vector(&local_60.m_transitions);
      pNVar4 = pNVar4 + 1;
    } while (pNVar4 != *(NFABaseState<char,_int> **)(lVar3 + 0x10));
    src = *(NFABaseState<char,_int> **)(lVar3 + 8);
    this = local_38;
  }
  NFABaseState<char,_int>::rebase_transitions
            ((this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,src,iVar2);
  local_60._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019bf68;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  add_state(this,(CharClass<char> *)&local_60);
  local_60._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019bf68;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
            ((vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *)
             &local_60.m_transitions);
  local_60._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019bf68;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar1 = (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  NFABaseState<char,_int>::add_transition
            (pNVar1 + iVar2,(CharClass<char> *)&local_60,
             (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states
                                 .
                                 super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) >> 3) *
             -0x33333333 + -1,false);
  local_60._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019bf68;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
            ((vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *)
             &local_60.m_transitions);
  return extraout_EAX;
}

Assistant:

void select(const NFA<TCHAR>& nfa)
    {
        int initial_size = m_states.size();

        m_states[0].add_transition(CharClass<TCHAR>(), initial_size);

        auto i = nfa.m_states.cbegin() + 1;

        for (; i != nfa.m_states.cend(); i++)
        {
            m_states.push_back(i->offset(initial_size - 1));
        }

        m_states[0].rebase_transitions(nfa.m_states[0], initial_size - 1);

        //Add the join state
        add_state(CharClass<TCHAR>());

        add_transition_from(CharClass<TCHAR>(), initial_size - 1);
    }